

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O3

int __thiscall gdsForge::gdsCopyFile(gdsForge *this,string *fileName)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  ostream *poVar4;
  ushort *puVar5;
  void *__ptr;
  iterator iVar6;
  int *arrInt;
  ushort uVar7;
  int iVar8;
  byte bVar9;
  string strName;
  ifstream gdsFileIn;
  key_type local_298;
  uint local_274;
  gdsForge *local_270;
  ulong local_268;
  long *local_260;
  ulong local_258;
  long local_250 [2];
  string *local_240;
  string local_238 [520];
  
  local_270 = this;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Copying GDS binaries from \"",0x1b);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(fileName->_M_dataplus)._M_p,fileName->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ifstream::ifstream(local_238);
  std::ifstream::open(local_238,(_Ios_Openmode)fileName);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"FAILED to open GDS file \"",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    iVar8 = 1;
    std::ostream::flush();
  }
  else {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    local_298._M_string_length = 0;
    local_298.field_2._M_local_buf[0] = '\0';
    if (gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_ == '\0') {
      gdsCopyFile();
    }
    local_240 = fileName;
    std::istream::seekg((long)local_238,_S_beg);
    bVar9 = 1;
    bVar1 = 0;
    do {
      puVar5 = (ushort *)operator_new__(2);
      std::istream::read((char *)local_238,(long)puVar5);
      uVar3 = *puVar5;
      std::istream::seekg((long)local_238,~_S_cur);
      uVar7 = uVar3 << 8 | uVar3 >> 8;
      local_268 = (ulong)(uint)uVar7;
      __ptr = operator_new__(local_268);
      std::istream::read((char *)local_238,(long)__ptr);
      uVar3 = *(ushort *)((long)__ptr + 2) << 8 | *(ushort *)((long)__ptr + 2) >> 8;
      local_274 = (uint)uVar3;
      if (local_274 == 0x502) {
        bVar1 = 1;
      }
      if ((bool)(uVar3 == 0x606 & bVar1)) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_298,0,(char *)local_298._M_string_length,0x11773b);
        if (4 < uVar7) {
          bVar9 = 4;
          do {
            local_260 = local_250;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_260,local_298._M_dataplus._M_p,
                       (char *)(local_298._M_string_length + (long)local_298._M_dataplus._M_p));
            std::__cxx11::string::_M_replace_aux((ulong)&local_260,local_258,0,'\x01');
            std::__cxx11::string::operator=((string *)&local_298,(string *)&local_260);
            if (local_260 != local_250) {
              operator_delete(local_260,local_250[0] + 1);
            }
            bVar9 = bVar9 + 1;
          } while (bVar9 < uVar7);
        }
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t,
                       &local_298);
        if ((_Rb_tree_header *)iVar6._M_node ==
            &gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_._M_t._M_impl.
             super__Rb_tree_header) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Structure: \"",0xc);
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                              local_298._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," copying",8);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&gdsCopyFile(std::__cxx11::string_const&)::StoredStr_abi_cxx11_,&local_298);
          arrInt = gsdTime();
          GDSwriteInt(local_270,0x502,arrInt,0xc);
          bVar9 = 0;
          goto LAB_0010f152;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Structure: \"",0xc);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_298._M_dataplus._M_p,
                            local_298._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," already copied.",0x10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        bVar9 = 0;
        std::ostream::flush();
        bVar1 = 0;
      }
      else {
        bVar9 = local_274 == 0x502 | bVar9;
LAB_0010f152:
        if (!(bool)(~bVar1 & 1 | bVar9)) {
          fwrite(__ptr,1,local_268,(FILE *)local_270->gdsFile);
          bVar9 = 0;
        }
      }
      if (local_274 == 0x700) {
        bVar1 = 0;
      }
    } while (local_274 != 0x400);
    operator_delete__(__ptr);
    std::ifstream::close();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Copying GDS binaries of \"",0x19);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(local_240->_M_dataplus)._M_p,
                        local_240->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\" done.",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,
                      CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                               local_298.field_2._M_local_buf[0]) + 1);
    }
    iVar8 = 0;
  }
  std::ifstream::~ifstream(local_238);
  return iVar8;
}

Assistant:

int gdsForge::gdsCopyFile(const string &fileName)
{
  cout << "Copying GDS binaries from \"" << fileName << "\"" << endl;

  ifstream gdsFileIn;

  gdsFileIn.open(fileName, ios::in | ios::binary);

  if (!gdsFileIn.is_open()) {
    cout << "FAILED to open GDS file \"" << fileName << "\"" << endl;
    return 1;
  }

  char *readBlk;
  uint32_t sizeBlk;
  uint32_t hexKey;
  bool cpEN = false;
  bool firstLine = true;
  string strName;
  static set<string> StoredStr;

  gdsFileIn.seekg(0, ios::beg);

  do {
    readBlk = new char[2];
    gdsFileIn.read(readBlk, 2); // Get the size of the record
    sizeBlk = (((unsigned char)readBlk[0] << 8) |
               (unsigned char)readBlk[1]); // Interpret the size of the record

    gdsFileIn.seekg(-2, ios::cur);
    readBlk = new char[sizeBlk]; // Reading in the full length of the record
                                 // excluding the size
    gdsFileIn.read(readBlk, sizeBlk);

    hexKey = (((unsigned char)readBlk[2] << 8) | (unsigned char)readBlk[3]);

    if (hexKey == GDS_BGNSTR) { // Beginning of structure
      cpEN = true;
      firstLine = true;
    }

    if (cpEN && hexKey == GDS_STRNAME) { // get the name of the structure
      strName = "";
      for (uint8_t i = 4; i < sizeBlk; i++) {
        strName = strName + readBlk[i];
      }

      if (StoredStr.find(strName) != StoredStr.end()) { // found
        cout << "Structure: \"" << strName << "\""
             << " already copied." << endl;
        cpEN = false;
      } else { // didnt find
        cout << "Structure: \"" << strName << "\""
             << " copying" << endl;
        StoredStr.insert(strName);
        this->GDSwriteInt(GDS_BGNSTR, gsdTime(), 12);
      }

      firstLine = false;
    }

    if (cpEN && !firstLine) { // Write(copy) the GSD record
      fwrite(readBlk, 1, sizeBlk, this->gdsFile);
    }

    if (hexKey == GDS_ENDSTR) { // end of structure
      cpEN = false;
    }

  } while (hexKey != GDS_ENDLIB);

  delete[] readBlk;

  gdsFileIn.close();
  cout << "Copying GDS binaries of \"" << fileName << "\" done." << endl;
  return 0;
}